

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_sleep(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int64_t iVar4;
  JSValue JVar5;
  int64_t delay;
  timespec ts;
  int64_t local_20;
  timespec local_18;
  
  iVar1 = JS_ToInt64(ctx,&local_20,*argv);
  if (iVar1 == 0) {
    if (local_20 < 0) {
      local_20 = 0;
    }
    local_18.tv_sec = local_20 / 1000;
    local_18.tv_nsec = (local_20 % 1000) * 1000000;
    uVar2 = nanosleep(&local_18,(timespec *)0x0);
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      uVar2 = -*piVar3;
    }
    iVar4 = 0;
  }
  else {
    iVar4 = 6;
    uVar2 = 0;
  }
  JVar5.u._4_4_ = 0;
  JVar5.u.int32 = uVar2;
  JVar5.tag = iVar4;
  return JVar5;
}

Assistant:

static JSValue js_os_sleep(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int64_t delay;
    int ret;
    
    if (JS_ToInt64(ctx, &delay, argv[0]))
        return JS_EXCEPTION;
    if (delay < 0)
        delay = 0;
#if defined(_WIN32)
    {
        if (delay > INT32_MAX)
            delay = INT32_MAX;
        Sleep(delay);
        ret = 0;
    }
#else
    {
        struct timespec ts;

        ts.tv_sec = delay / 1000;
        ts.tv_nsec = (delay % 1000) * 1000000;
        ret = js_get_errno(nanosleep(&ts, NULL));
    }
#endif
    return JS_NewInt32(ctx, ret);
}